

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxDumper.h
# Opt level: O2

Action __thiscall
psy::C::SyntaxDumper::visitIncompleteDeclaration
          (SyntaxDumper *this,IncompleteDeclarationSyntax *node)

{
  long lVar1;
  IncompleteDeclarationSyntax *pIVar2;
  IncompleteDeclarationSyntax local_50 [56];
  
  traverseDeclaration(this,(DeclarationSyntax *)node);
  pIVar2 = node + 0x28;
  while (lVar1 = *(long *)pIVar2, lVar1 != 0) {
    (**(code **)(*(long *)this + 0x2f0))(this,*(undefined8 *)(lVar1 + 8));
    pIVar2 = (IncompleteDeclarationSyntax *)(lVar1 + 0x10);
  }
  IncompleteDeclarationSyntax::semicolonToken(local_50);
  (**(code **)(*(long *)this + 0x2e8))(this,local_50,node);
  psy::C::SyntaxToken::~SyntaxToken((SyntaxToken *)local_50);
  return Skip;
}

Assistant:

virtual Action visitIncompleteDeclaration(const IncompleteDeclarationSyntax* node) override
    {
        traverseDeclaration(node);
        for (auto it = node->specifiers(); it; it = it->next)
            nonterminal(it->value);
        terminal(node->semicolonToken(), node);
        return Action::Skip;
    }